

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klibexec.h
# Opt level: O2

void kObjectProto_SetObject(KonohaContext *kctx,void *ao,ksymbol_t key,ktypeattr_t ty,void *val)

{
  KProtoMap *pKVar1;
  KKeyValue kvs;
  KKeyValue local_20;
  
  local_20.typeAttr = ty | 0x80000000;
  pKVar1 = *(KProtoMap **)((long)ao + 0x10);
  local_20.key = key;
  local_20.field_2 = (anon_union_8_4_5585e3e3_for_KKeyValue_2)val;
  if (pKVar1 == (KProtoMap *)0x0) {
    pKVar1 = new_KProtoMap(kctx);
    *(KProtoMap **)((long)ao + 0x10) = pKVar1;
  }
  KDict_Set(kctx,&pKVar1->dict,&local_20);
  (*(kctx->platApi->GCModule).WriteBarrier)(kctx,(kObjectVar *)ao);
  return;
}

Assistant:

static void kObjectProto_SetObject(KonohaContext *kctx, kAbstractObject *ao, ksymbol_t key, ktypeattr_t ty, kAbstractObject *val)
{
	kObjectVar *o = (kObjectVar *)ao;
	KKeyValue kvs = {key, ty | KTypeAttr_Boxed, {(uintptr_t)val}};
	if(KGetProtoMap(o) == NULL) {
		KSetProtoMap(o, new_KProtoMap(kctx));
	}
	KDict *dict = &(KGetProtoMap(o)->dict);
	KDict_Set(kctx, dict, &kvs);
	PLATAPI GCModule.WriteBarrier(kctx, o);
}